

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

ndicapi * ndiOpenNetwork(char *hostname,int port)

{
  undefined8 in_RAX;
  ndicapi *__s;
  size_t __n;
  char *pcVar1;
  char *__s_00;
  char *__s_01;
  NDISocketHandle socket;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  ndiSocketOpen(hostname,port,&local_34);
  if (local_34 != -1) {
    __s = (ndicapi *)malloc(0x4588);
    if (__s != (ndicapi *)0x0) {
      memset(__s,0,0x4588);
      __n = strlen(hostname);
      pcVar1 = (char *)operator_new__(__n + 1);
      __s->Hostname = pcVar1;
      strncpy(pcVar1,hostname,__n);
      __s->Hostname = pcVar1;
      __s->Port = port;
      __s->Socket = local_34;
      __s->SerialDevice = -1;
      __s->SerialDeviceName = (char *)0x0;
      pcVar1 = (char *)malloc(0x800);
      __s->Command = pcVar1;
      __s_00 = (char *)malloc(0x800);
      __s->Reply = __s_00;
      __s_01 = (char *)malloc(0x800);
      __s->ReplyNoCRC = __s_01;
      memset(pcVar1,0,0x800);
      memset(__s_00,0,0x800);
      memset(__s_01,0,0x800);
      return __s;
    }
    ndiSocketClose(local_34);
  }
  return (ndicapi *)0x0;
}

Assistant:

ndicapiExport ndicapi* ndiOpenNetwork(const char* hostname, int port)
{
  NDISocketHandle socket;
  ndicapi* device;

  int connected = ndiSocketOpen(hostname, port, socket);

  if (socket == -1 || connected == -1)
  {
    return NULL;
  }

  device = (ndicapi*)malloc(sizeof(ndicapi));

  if (device == 0)
  {
    ndiSocketClose(socket);
    return NULL;
  }

  memset(device, 0, sizeof(ndicapi));
  device->Hostname = new char[strlen(hostname) + 1];
  device->Hostname = strncpy(device->Hostname, hostname, strlen(hostname));
  device->Port = port;
  device->Socket = socket;
  device->SerialDevice = NDI_INVALID_HANDLE;
  device->SerialDeviceName = NULL;

  // allocate the buffers
  device->Command = (char*)malloc(2048);
  device->Reply = (char*)malloc(2048);
  device->ReplyNoCRC = (char*)malloc(2048);

  // initialize the allocated memory
  memset(device->Command, 0, 2048);
  memset(device->Reply, 0, 2048);
  memset(device->ReplyNoCRC, 0, 2048);

  return device;
}